

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

void __thiscall AAmbientSound::Deactivate(AAmbientSound *this,AActor *activator)

{
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  AActor::Deactivate(&this->super_AActor,activator);
  if ((this->super_AActor).field_0x4bc == '\x01') {
    (this->super_AActor).field_0x4bc = 0;
    uVar1 = (this->super_AActor).args[0];
    pNVar2 = Ambients.Nodes + (Ambients.Size - 1 & uVar1);
    do {
      pNVar3 = pNVar2;
      if ((pNVar3 == (Node *)0x0) || (pNVar3->Next == (Node *)0x1)) {
        pNVar3 = (Node *)0x0;
        break;
      }
      pNVar2 = pNVar3->Next;
    } while ((pNVar3->Pair).Key != uVar1);
    if ((pNVar3 != (Node *)0x0) && ((~(pNVar3->Pair).Value.type & 3) == 0)) {
      S_StopSound(&this->super_AActor,4);
      return;
    }
  }
  return;
}

Assistant:

void AAmbientSound::Deactivate (AActor *activator)
{
	Super::Deactivate (activator);
	if (bActive)
	{
		bActive = false;
		FAmbientSound *ambient = Ambients.CheckKey(args[0]);
		if (ambient != NULL && (ambient->type & CONTINUOUS) == CONTINUOUS)
		{
			S_StopSound (this, CHAN_BODY);
		}
	}
}